

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audioview.cpp
# Opt level: O2

void __thiscall FSSAudioView::setAudioData(FSSAudioView *this,PBuffer *data,QString *format)

{
  element_type *peVar1;
  size_t sVar2;
  char cVar3;
  QTemporaryFile *this_00;
  size_t sVar4;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char16_t> local_58;
  char *local_40;
  QArrayDataPointer<char16_t> local_38;
  
  if (this->file != (QTemporaryFile *)0x0) {
    (**(code **)(*(long *)this->file + 0x20))();
    this->file = (QTemporaryFile *)0x0;
  }
  QWidget::setEnabled(SUB81(this->buttonPlay,0));
  QWidget::setEnabled(SUB81(this->slider,0));
  if ((data->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr != (element_type *)0x0)
  {
    this_00 = (QTemporaryFile *)operator_new(0x10);
    QDir::tempPath();
    operator+((QString *)&local_70,(QString *)&local_38,"/XXXXXX.");
    operator+((QString *)&local_58,(QString *)&local_70,format);
    QTemporaryFile::QTemporaryFile(this_00,(QString *)&local_58);
    this->file = this_00;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
    cVar3 = (**(code **)(*(long *)this->file + 0x68))(this->file,3);
    if (cVar3 == '\0') {
      local_58.d._0_4_ = 2;
      local_58.size._4_4_ = 0;
      local_58._4_8_ = 0;
      local_58._12_8_ = 0;
      local_40 = "default";
      QMessageLogger::debug();
      QDebug::operator<<((QDebug *)&local_70,"Failed to open temporary file");
    }
    else {
      peVar1 = (data->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      sVar2 = peVar1->size;
      sVar4 = QIODevice::write((char *)this->file,(longlong)peVar1->data);
      if (sVar4 == sVar2) {
        (**(code **)(*(long *)this->file + 0x70))();
        return;
      }
      local_58.d._0_4_ = 2;
      local_58.size._4_4_ = 0;
      local_58._4_8_ = 0;
      local_58._12_8_ = 0;
      local_40 = "default";
      QMessageLogger::debug();
      QDebug::operator<<((QDebug *)&local_70,"Failed to write to temporary file");
    }
    QDebug::~QDebug((QDebug *)&local_70);
  }
  return;
}

Assistant:

void
FSSAudioView::setAudioData(PBuffer data, const QString &format) {
  if (file != nullptr) {
    delete file;
    file = nullptr;
  }
  buttonPlay->setEnabled(false);
  slider->setEnabled(false);

  if (!data) {
    return;
  }

  file = new QTemporaryFile(QDir::tempPath() + "/XXXXXX." + format);
  if (!file->open()) {
    qDebug() << "Failed to open temporary file";
    return;
  }
  qint64 size = data->get_size();
  if (file->write((const char*)data->get_data(), size) != size) {
    qDebug() << "Failed to write to temporary file";
    return;
  }
  file->close();
}